

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS
ref_migrate_native_rcb_direction
          (REF_MPI ref_mpi,REF_INT n,REF_DBL *xyz,REF_DBL *transform,REF_INT npart,REF_INT offset,
          REF_INT *owners,REF_INT *locals,REF_MPI global_mpi,REF_INT *part,REF_INT seed,REF_INT dir,
          REF_BOOL twod)

{
  int iVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_DBL transformed [3];
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT nrecv;
  REF_INT *recv_locals;
  REF_INT *recv_part;
  REF_INT *my_id;
  double dStack_138;
  REF_BOOL cycle_dir;
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_DBL ratio_shift;
  REF_MPI pRStack_118;
  REF_INT seed_base;
  REF_MPI split_mpi;
  REF_LONG total;
  REF_LONG position;
  REF_DBL value1;
  REF_DBL value0;
  REF_DBL ratio;
  REF_INT *bal_locals1;
  REF_INT *bal_locals0;
  REF_INT *locals1;
  REF_INT *locals0;
  REF_INT *bal_owners1;
  REF_INT *bal_owners0;
  REF_INT *owners1;
  REF_INT *owners0;
  REF_DBL *bal_xyz1;
  REF_DBL *bal_xyz0;
  REF_DBL *x;
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_INT bal_n1;
  REF_INT bal_n0;
  REF_INT offset1;
  REF_INT offset0;
  REF_INT npart1;
  REF_INT npart0;
  REF_INT n1;
  REF_INT n0;
  REF_INT j;
  REF_INT i;
  REF_INT offset_local;
  REF_INT npart_local;
  REF_DBL *transform_local;
  REF_DBL *xyz_local;
  REF_MPI pRStack_38;
  REF_INT n_local;
  REF_MPI ref_mpi_local;
  
  ratio_shift._4_4_ = 3;
  my_id._4_4_ = 0;
  if (npart == 0) {
    ref_mpi_local._4_4_ = 0;
  }
  else {
    j = offset;
    i = npart;
    _offset_local = transform;
    transform_local = xyz;
    xyz_local._4_4_ = n;
    pRStack_38 = ref_mpi;
    if (npart == 1) {
      if (n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x19d,"ref_migrate_native_rcb_direction","malloc my_id of REF_INT negative");
        ref_mpi_local._4_4_ = 1;
      }
      else {
        recv_part = (REF_INT *)malloc((long)n << 2);
        if (recv_part == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x19d,"ref_migrate_native_rcb_direction","malloc my_id of REF_INT NULL");
          ref_mpi_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < xyz_local._4_4_;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            recv_part[ref_private_macro_code_rss_1] = j;
          }
          uVar2 = ref_mpi_blindsend(global_mpi,owners,recv_part,1,xyz_local._4_4_,&recv_locals,
                                    &ref_private_macro_code_rss,1);
          if (uVar2 == 0) {
            uVar2 = ref_mpi_blindsend(global_mpi,owners,locals,1,xyz_local._4_4_,
                                      (void **)&ref_malloc_init_i,&ref_private_macro_code_rss,1);
            if (uVar2 == 0) {
              for (n0 = 0; n0 < ref_private_macro_code_rss; n0 = n0 + 1) {
                part[*(int *)((long)_ref_malloc_init_i + (long)n0 * 4)] = recv_locals[n0];
              }
              if (recv_locals != (REF_INT *)0x0) {
                free(recv_locals);
              }
              if (_ref_malloc_init_i != (void *)0x0) {
                free(_ref_malloc_init_i);
              }
              if (recv_part != (REF_INT *)0x0) {
                free(recv_part);
              }
              ref_mpi_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x1a3,"ref_migrate_native_rcb_direction",(ulong)uVar2,"recv loc");
              ref_mpi_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x1a0,"ref_migrate_native_rcb_direction",(ulong)uVar2,"recv part");
            ref_mpi_local._4_4_ = uVar2;
          }
        }
      }
    }
    else if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1ab,"ref_migrate_native_rcb_direction","malloc x of REF_DBL negative");
      ref_mpi_local._4_4_ = 1;
    }
    else {
      bal_xyz0 = (REF_DBL *)malloc((long)n << 3);
      if (bal_xyz0 == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x1ab,"ref_migrate_native_rcb_direction","malloc x of REF_DBL NULL");
        ref_mpi_local._4_4_ = 2;
      }
      else {
        if ((dir < 0) || (2 < dir)) {
          transformed[2]._4_4_ =
               ref_migrate_split_dir(pRStack_38,xyz_local._4_4_,transform_local,_offset_local,&dir);
          if (transformed[2]._4_4_ != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x1ad,"ref_migrate_native_rcb_direction",(ulong)transformed[2]._4_4_,"dir");
            return transformed[2]._4_4_;
          }
          transformed[2]._4_4_ = 0;
        }
        if ((dir < 0) || (2 < dir)) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x1ae,"ref_migrate_native_rcb_direction","3D dir");
          ref_mpi_local._4_4_ = 1;
        }
        else {
          transformed[2]._0_4_ = ref_migrate_split_ratio(i,&value0);
          if (transformed[2]._0_4_ == 0) {
            ratio0 = (double)(seed % ratio_shift._4_4_) / (double)ratio_shift._4_4_;
            ratio1 = value0 * ratio0;
            dStack_138 = 1.0 - (value0 - ratio1);
            transformed[2]._0_4_ = 0;
            for (n0 = 0; n0 < xyz_local._4_4_; n0 = n0 + 1) {
              uVar2 = ref_matrix_ax(3,_offset_local,transform_local + n0 * 3,
                                    (REF_DBL *)&ref_private_macro_code_rss_5);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x1b6,"ref_migrate_native_rcb_direction",(ulong)uVar2,"ax");
                return uVar2;
              }
              bal_xyz0[n0] = *(REF_DBL *)(&ref_private_macro_code_rss_5 + (long)dir * 2);
            }
            split_mpi = (REF_MPI)(long)xyz_local._4_4_;
            uVar2 = ref_mpi_allsum(pRStack_38,&split_mpi,1,2);
            if (uVar2 == 0) {
              total = (REF_LONG)((double)(long)split_mpi * ratio1);
              uVar2 = ref_search_selection(pRStack_38,xyz_local._4_4_,bal_xyz0,total,&value1);
              if (uVar2 == 0) {
                total = (REF_LONG)((double)(long)split_mpi * dStack_138);
                uVar2 = ref_search_selection
                                  (pRStack_38,xyz_local._4_4_,bal_xyz0,total,(REF_DBL *)&position);
                if (uVar2 == 0) {
                  if (xyz_local._4_4_ * 3 < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x1c2,"ref_migrate_native_rcb_direction",
                           "malloc xyz0 of REF_DBL negative");
                    ref_mpi_local._4_4_ = 1;
                  }
                  else {
                    xyz1 = (REF_DBL *)malloc((long)(xyz_local._4_4_ * 3) << 3);
                    if (xyz1 == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x1c2,"ref_migrate_native_rcb_direction","malloc xyz0 of REF_DBL NULL"
                            );
                      ref_mpi_local._4_4_ = 2;
                    }
                    else if (xyz_local._4_4_ * 3 < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x1c3,"ref_migrate_native_rcb_direction",
                             "malloc xyz1 of REF_DBL negative");
                      ref_mpi_local._4_4_ = 1;
                    }
                    else {
                      x = (REF_DBL *)malloc((long)(xyz_local._4_4_ * 3) << 3);
                      if (x == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x1c3,"ref_migrate_native_rcb_direction",
                               "malloc xyz1 of REF_DBL NULL");
                        ref_mpi_local._4_4_ = 2;
                      }
                      else if (xyz_local._4_4_ < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x1c4,"ref_migrate_native_rcb_direction",
                               "malloc owners0 of REF_INT negative");
                        ref_mpi_local._4_4_ = 1;
                      }
                      else {
                        owners1 = (REF_INT *)malloc((long)xyz_local._4_4_ << 2);
                        if (owners1 == (REF_INT *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x1c4,"ref_migrate_native_rcb_direction",
                                 "malloc owners0 of REF_INT NULL");
                          ref_mpi_local._4_4_ = 2;
                        }
                        else if (xyz_local._4_4_ < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x1c5,"ref_migrate_native_rcb_direction",
                                 "malloc owners1 of REF_INT negative");
                          ref_mpi_local._4_4_ = 1;
                        }
                        else {
                          bal_owners0 = (REF_INT *)malloc((long)xyz_local._4_4_ << 2);
                          if (bal_owners0 == (REF_INT *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x1c5,"ref_migrate_native_rcb_direction",
                                   "malloc owners1 of REF_INT NULL");
                            ref_mpi_local._4_4_ = 2;
                          }
                          else if (xyz_local._4_4_ < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x1c6,"ref_migrate_native_rcb_direction",
                                   "malloc locals0 of REF_INT negative");
                            ref_mpi_local._4_4_ = 1;
                          }
                          else {
                            locals1 = (REF_INT *)malloc((long)xyz_local._4_4_ << 2);
                            if (locals1 == (REF_INT *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                     ,0x1c6,"ref_migrate_native_rcb_direction",
                                     "malloc locals0 of REF_INT NULL");
                              ref_mpi_local._4_4_ = 2;
                            }
                            else if (xyz_local._4_4_ < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                     ,0x1c7,"ref_migrate_native_rcb_direction",
                                     "malloc locals1 of REF_INT negative");
                              ref_mpi_local._4_4_ = 1;
                            }
                            else {
                              bal_locals0 = (REF_INT *)malloc((long)xyz_local._4_4_ << 2);
                              if (bal_locals0 == (REF_INT *)0x0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                       ,0x1c7,"ref_migrate_native_rcb_direction",
                                       "malloc locals1 of REF_INT NULL");
                                ref_mpi_local._4_4_ = 2;
                              }
                              else {
                                npart0 = 0;
                                npart1 = 0;
                                for (n0 = 0; n0 < xyz_local._4_4_; n0 = n0 + 1) {
                                  if ((bal_xyz0[n0] < value1) || ((double)position < bal_xyz0[n0]))
                                  {
                                    for (n1 = 0; n1 < 3; n1 = n1 + 1) {
                                      xyz1[n1 + npart0 * 3] = transform_local[n1 + n0 * 3];
                                    }
                                    owners1[npart0] = owners[n0];
                                    locals1[npart0] = locals[n0];
                                    npart0 = npart0 + 1;
                                  }
                                  else {
                                    for (n1 = 0; n1 < 3; n1 = n1 + 1) {
                                      x[n1 + npart1 * 3] = transform_local[n1 + n0 * 3];
                                    }
                                    bal_owners0[npart1] = owners[n0];
                                    bal_locals0[npart1] = locals[n0];
                                    npart1 = npart1 + 1;
                                  }
                                }
                                if ((long)xyz_local._4_4_ == (long)(npart0 + npart1)) {
                                  offset0 = i / 2;
                                  offset1 = i - offset0;
                                  bal_n0 = j;
                                  bal_n1 = j + offset0;
                                  uVar2 = ref_mpi_balance(pRStack_38,3,npart0,xyz1,0,offset0 + -1,
                                                          (REF_INT *)((long)&xyz0 + 4),&bal_xyz1,3);
                                  if (uVar2 == 0) {
                                    uVar2 = ref_mpi_balance(pRStack_38,3,npart1,x,offset0,
                                                            pRStack_38->n + -1,(REF_INT *)&xyz0,
                                                            &owners0,3);
                                    if (uVar2 == 0) {
                                      uVar2 = ref_mpi_balance(pRStack_38,1,npart0,owners1,0,
                                                              offset0 + -1,
                                                              (REF_INT *)((long)&xyz0 + 4),
                                                              &bal_owners1,1);
                                      if (uVar2 == 0) {
                                        uVar2 = ref_mpi_balance(pRStack_38,1,npart1,bal_owners0,
                                                                offset0,pRStack_38->n + -1,
                                                                (REF_INT *)&xyz0,&locals0,1);
                                        if (uVar2 == 0) {
                                          uVar2 = ref_mpi_balance(pRStack_38,1,npart0,locals1,0,
                                                                  offset0 + -1,
                                                                  (REF_INT *)((long)&xyz0 + 4),
                                                                  &bal_locals1,1);
                                          if (uVar2 == 0) {
                                            uVar2 = ref_mpi_balance(pRStack_38,1,npart1,bal_locals0,
                                                                    offset0,pRStack_38->n + -1,
                                                                    (REF_INT *)&xyz0,(void **)&ratio
                                                                    ,1);
                                            if (uVar2 == 0) {
                                              uVar2 = ref_mpi_front_comm(pRStack_38,
                                                                         &stack0xfffffffffffffee8,
                                                                         offset0);
                                              if (uVar2 == 0) {
                                                if (my_id._4_4_ == 0) {
                                                  dir = -1;
                                                }
                                                else {
                                                  iVar1 = dir + 1;
                                                  if (2 < dir + 1) {
                                                    iVar1 = dir + -2;
                                                  }
                                                  dir = iVar1;
                                                  if ((twod != 0) && (1 < dir)) {
                                                    dir = dir + -2;
                                                  }
                                                }
                                                if (pRStack_38->id < offset0) {
                                                  uVar2 = ref_migrate_native_rcb_direction
                                                                    (pRStack_118,xyz0._4_4_,bal_xyz1
                                                                     ,_offset_local,offset0,bal_n0,
                                                                     bal_owners1,bal_locals1,
                                                                     global_mpi,part,seed,dir,twod);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                  ,0x203,"ref_migrate_native_rcb_direction",
                                                  (ulong)uVar2,"recurse 0");
                                                  return uVar2;
                                                  }
                                                }
                                                else {
                                                  uVar2 = ref_migrate_native_rcb_direction
                                                                    (pRStack_118,(REF_INT)xyz0,
                                                                     (REF_DBL *)owners0,
                                                                     _offset_local,offset1,bal_n1,
                                                                     locals0,(REF_INT *)ratio,
                                                                     global_mpi,part,seed,dir,twod);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                  ,0x208,"ref_migrate_native_rcb_direction",
                                                  (ulong)uVar2,"recurse 1");
                                                  return uVar2;
                                                  }
                                                }
                                                uVar2 = ref_mpi_join_comm(pRStack_118);
                                                if (uVar2 == 0) {
                                                  uVar2 = ref_mpi_free(pRStack_118);
                                                  if (uVar2 == 0) {
                                                    if (ratio != 0.0) {
                                                      free((void *)ratio);
                                                    }
                                                    if (bal_locals1 != (REF_INT *)0x0) {
                                                      free(bal_locals1);
                                                    }
                                                    if (locals0 != (REF_INT *)0x0) {
                                                      free(locals0);
                                                    }
                                                    if (bal_owners1 != (REF_INT *)0x0) {
                                                      free(bal_owners1);
                                                    }
                                                    if (owners0 != (REF_INT *)0x0) {
                                                      free(owners0);
                                                    }
                                                    if (bal_xyz1 != (REF_DBL *)0x0) {
                                                      free(bal_xyz1);
                                                    }
                                                    if (bal_locals0 != (REF_INT *)0x0) {
                                                      free(bal_locals0);
                                                    }
                                                    if (locals1 != (REF_INT *)0x0) {
                                                      free(locals1);
                                                    }
                                                    if (bal_owners0 != (REF_INT *)0x0) {
                                                      free(bal_owners0);
                                                    }
                                                    if (owners1 != (REF_INT *)0x0) {
                                                      free(owners1);
                                                    }
                                                    if (x != (REF_DBL *)0x0) {
                                                      free(x);
                                                    }
                                                    if (xyz1 != (REF_DBL *)0x0) {
                                                      free(xyz1);
                                                    }
                                                    if (bal_xyz0 != (REF_DBL *)0x0) {
                                                      free(bal_xyz0);
                                                    }
                                                    ref_mpi_local._4_4_ = 0;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                  ,0x20c,"ref_migrate_native_rcb_direction",
                                                  (ulong)uVar2,"new free");
                                                  ref_mpi_local._4_4_ = uVar2;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                  ,0x20b,"ref_migrate_native_rcb_direction",
                                                  (ulong)uVar2,"join");
                                                  ref_mpi_local._4_4_ = uVar2;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                  ,0x1f6,"ref_migrate_native_rcb_direction",
                                                  (ulong)uVar2,"split");
                                                ref_mpi_local._4_4_ = uVar2;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                  ,500,"ref_migrate_native_rcb_direction",
                                                  (ulong)uVar2,"split local 1");
                                              ref_mpi_local._4_4_ = uVar2;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                  ,0x1f0,"ref_migrate_native_rcb_direction",
                                                  (ulong)uVar2,"split local 0");
                                            ref_mpi_local._4_4_ = uVar2;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                                 ,0x1ec,"ref_migrate_native_rcb_direction",
                                                 (ulong)uVar2,"split owner 1");
                                          ref_mpi_local._4_4_ = uVar2;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                               ,0x1e8,"ref_migrate_native_rcb_direction",
                                               (ulong)uVar2,"split owner 0");
                                        ref_mpi_local._4_4_ = uVar2;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                             ,0x1e4,"ref_migrate_native_rcb_direction",(ulong)uVar2,
                                             "split 1");
                                      ref_mpi_local._4_4_ = uVar2;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                           ,0x1e0,"ref_migrate_native_rcb_direction",(ulong)uVar2,
                                           "split 0");
                                    ref_mpi_local._4_4_ = uVar2;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                         ,0x1d8,"ref_migrate_native_rcb_direction","conservation",
                                         (long)xyz_local._4_4_,(long)(npart0 + npart1));
                                  ref_mpi_local._4_4_ = 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x1c0,"ref_migrate_native_rcb_direction",(ulong)uVar2,"target");
                  ref_mpi_local._4_4_ = uVar2;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x1be,"ref_migrate_native_rcb_direction",(ulong)uVar2,"target");
                ref_mpi_local._4_4_ = uVar2;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x1bb,"ref_migrate_native_rcb_direction",(ulong)uVar2,"high_pos");
              ref_mpi_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x1af,"ref_migrate_native_rcb_direction",(ulong)transformed[2]._0_4_,"ratio");
            ref_mpi_local._4_4_ = transformed[2]._0_4_;
          }
        }
      }
    }
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_direction(
    REF_MPI ref_mpi, REF_INT n, REF_DBL *xyz, REF_DBL *transform, REF_INT npart,
    REF_INT offset, REF_INT *owners, REF_INT *locals, REF_MPI global_mpi,
    REF_INT *part, REF_INT seed, REF_INT dir, REF_BOOL twod) {
  REF_INT i, j, n0, n1, npart0, npart1, offset0, offset1;
  REF_INT bal_n0, bal_n1;
  REF_DBL *xyz0, *xyz1, *x;
  REF_DBL *bal_xyz0, *bal_xyz1;
  REF_INT *owners0, *owners1;
  REF_INT *bal_owners0, *bal_owners1;
  REF_INT *locals0, *locals1;
  REF_INT *bal_locals0, *bal_locals1;
  REF_DBL ratio, value0, value1;
  REF_LONG position, total;
  REF_MPI split_mpi;
  REF_INT seed_base = 3;
  REF_DBL ratio_shift, ratio0, ratio1;
  REF_BOOL cycle_dir = REF_FALSE;

  if (0 == npart) return REF_SUCCESS;

  if (1 == npart) {
    REF_INT *my_id, *recv_part, *recv_locals, nrecv;
    ref_malloc_init(my_id, n, REF_INT, offset);
    RSS(ref_mpi_blindsend(global_mpi, owners, my_id, 1, n, (void **)&recv_part,
                          &nrecv, REF_INT_TYPE),
        "recv part");
    RSS(ref_mpi_blindsend(global_mpi, owners, locals, 1, n,
                          (void **)&recv_locals, &nrecv, REF_INT_TYPE),
        "recv loc");
    for (i = 0; i < nrecv; i++) part[recv_locals[i]] = recv_part[i];
    ref_free(recv_part);
    ref_free(recv_locals);
    ref_free(my_id);
    return REF_SUCCESS;
  }

  ref_malloc(x, n, REF_DBL);
  if (dir < 0 || 2 < dir)
    RSS(ref_migrate_split_dir(ref_mpi, n, xyz, transform, &dir), "dir");
  RAS(-1 < dir && dir < 3, "3D dir");
  RSS(ref_migrate_split_ratio(npart, &ratio), "ratio");
  ratio_shift = (REF_DBL)(seed % seed_base) / (REF_DBL)seed_base;
  ratio0 = ratio * ratio_shift;
  ratio1 = 1.0 - (ratio - ratio0);

  for (i = 0; i < n; i++) {
    REF_DBL transformed[3];
    RSS(ref_matrix_ax(3, transform, &(xyz[3 * i]), transformed), "ax");
    x[i] = transformed[dir];
  }

  total = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_LONG_TYPE), "high_pos");

  position = (REF_LONG)((REF_DBL)total * ratio0);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value0), "target");
  position = (REF_LONG)((REF_DBL)total * ratio1);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value1), "target");

  ref_malloc(xyz0, 3 * n, REF_DBL);
  ref_malloc(xyz1, 3 * n, REF_DBL);
  ref_malloc(owners0, n, REF_INT);
  ref_malloc(owners1, n, REF_INT);
  ref_malloc(locals0, n, REF_INT);
  ref_malloc(locals1, n, REF_INT);

  n0 = 0;
  n1 = 0;
  for (i = 0; i < n; i++) {
    if (x[i] < value0 || value1 < x[i]) {
      for (j = 0; j < 3; j++) xyz0[j + 3 * n0] = xyz[j + 3 * i];
      owners0[n0] = owners[i];
      locals0[n0] = locals[i];
      n0++;
    } else {
      for (j = 0; j < 3; j++) xyz1[j + 3 * n1] = xyz[j + 3 * i];
      owners1[n1] = owners[i];
      locals1[n1] = locals[i];
      n1++;
    }
  }
  REIS(n, n0 + n1, "conservation");
  npart0 = npart / 2;
  npart1 = npart - npart0;
  offset0 = offset;
  offset1 = offset + npart0;

  RSS(ref_mpi_balance(ref_mpi, 3, n0, (void *)xyz0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_xyz0), REF_DBL_TYPE),
      "split 0");
  RSS(ref_mpi_balance(ref_mpi, 3, n1, (void *)xyz1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_xyz1),
                      REF_DBL_TYPE),
      "split 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)owners0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_owners0), REF_INT_TYPE),
      "split owner 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)owners1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_owners1),
                      REF_INT_TYPE),
      "split owner 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)locals0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_locals0), REF_INT_TYPE),
      "split local 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)locals1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_locals1),
                      REF_INT_TYPE),
      "split local 1");

  RSS(ref_mpi_front_comm(ref_mpi, &split_mpi, npart0), "split");

  if (cycle_dir) {
    dir += 1;
    if (dir > 2) dir -= 3;
    if (twod && dir > 1) dir -= 2; /* twod skips Z */
  } else {
    dir = -1; /* direction computed in next recursion */
  }
  if (ref_mpi_rank(ref_mpi) < npart0) {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n0, bal_xyz0, transform, npart0, offset0,
            bal_owners0, bal_locals0, global_mpi, part, seed, dir, twod),
        "recurse 0");
  } else {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n1, bal_xyz1, transform, npart1, offset1,
            bal_owners1, bal_locals1, global_mpi, part, seed, dir, twod),
        "recurse 1");
  }

  RSS(ref_mpi_join_comm(split_mpi), "join");
  RSS(ref_mpi_free(split_mpi), "new free");

  ref_free(bal_locals1);
  ref_free(bal_locals0);

  ref_free(bal_owners1);
  ref_free(bal_owners0);

  ref_free(bal_xyz1);
  ref_free(bal_xyz0);

  ref_free(locals1);
  ref_free(locals0);

  ref_free(owners1);
  ref_free(owners0);

  ref_free(xyz1);
  ref_free(xyz0);

  ref_free(x);
  return REF_SUCCESS;
}